

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O0

long __thiscall kws::Parser::GetLineNumber(Parser *this,size_t pos,bool withoutComments)

{
  bool bVar1;
  reference puVar2;
  byte in_DL;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  Parser *in_RDI;
  const_iterator it;
  uint i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffb8;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffffc8;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_28;
  uint local_20;
  byte local_19;
  
  local_19 = in_DL & 1;
  if (local_19 != 0) {
    in_RSI = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             GetPositionWithComments(in_RDI,(size_t)in_RSI);
  }
  local_20 = 0;
  local_28._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_ffffffffffffffb8);
  while( true ) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_ffffffffffffffb8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_ffffffffffffffb8);
    in_stack_ffffffffffffffb8 = in_RSI;
    if (!bVar1) {
      return 0;
    }
    in_RSI = in_stack_ffffffffffffffb8;
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_28);
    if (in_stack_ffffffffffffffb8 <=
        (vector<unsigned_long,_std::allocator<unsigned_long>_> *)*puVar2) break;
    local_20 = local_20 + 1;
    in_stack_ffffffffffffffc8 =
         __gnu_cxx::
         __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
         ::operator++(in_stack_ffffffffffffffc8._M_current,(int)((ulong)in_RDI >> 0x20));
  }
  return (ulong)local_20;
}

Assistant:

long int Parser::GetLineNumber(size_t pos,bool withoutComments) const
{

  // if we have comments we add them to the list
  if(withoutComments)
    {
    pos = this->GetPositionWithComments(pos);
    }

  unsigned int i=0;
  auto it = m_Positions.begin();
  while(it != m_Positions.end())
    {
    if(pos<=(*it))
      {
      return i;
      }
    i++;
    it++;
    }
  return 0;
}